

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.cpp
# Opt level: O1

bool __thiscall
UnifiedRegex::CharSet<char16_t>::IsEqualTo(CharSet<char16_t> *this,CharSet<char16_t> *other)

{
  ulong uVar1;
  size_t sVar2;
  size_t sVar3;
  CharSetNode *pCVar4;
  code *pcVar5;
  bool bVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  undefined4 *puVar10;
  ulong uVar11;
  uint index;
  bool bVar12;
  
  sVar2 = (this->rep).compact.countPlusOne;
  sVar3 = (other->rep).compact.countPlusOne;
  uVar1 = sVar3 - 1;
  if (sVar2 - 1 < 5) {
    index = 0;
    if (sVar2 == sVar3 && uVar1 < 5) {
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      do {
        if (4 < (this->rep).compact.countPlusOne - 1) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar10 = 1;
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                             ,0x1ef,"(IsCompact())","IsCompact()");
          if (!bVar6) {
            pcVar5 = (code *)invalidInstructionException();
            (*pcVar5)();
          }
          *puVar10 = 0;
        }
        bVar6 = *(int *)&this->rep - 1U <= index;
        if (bVar6) {
          return bVar6;
        }
        uVar7 = GetCompactCharU(this,index);
        if ((other->rep).compact.countPlusOne - 1 < 5) {
          uVar8 = uVar7 & 0xffff;
          if ((((other->rep).compact.cs[0] != uVar8) && ((other->rep).compact.cs[1] != uVar8)) &&
             ((other->rep).compact.cs[2] != uVar8)) {
            bVar12 = (other->rep).compact.cs[3] == uVar8;
            goto LAB_00e70d6a;
          }
        }
        else {
          if ((uVar7 & 0xff00) == 0) {
            bVar12 = (*(uint *)((long)&other->rep + (ulong)((uVar7 & 0xffff) >> 5) * 4 + 8) >>
                      (uVar7 & 0x1f) & 1) != 0;
          }
          else {
            if ((other->rep).compact.countPlusOne == 0) {
              return bVar6;
            }
            bVar12 = Get_helper(other,uVar7 & 0xffff);
          }
LAB_00e70d6a:
          if (bVar12 == false) {
            return bVar6;
          }
        }
        index = index + 1;
      } while( true );
    }
  }
  else if ((4 < uVar1) && ((this->rep).compact.cs[0] == (other->rep).compact.cs[0])) {
    uVar1 = 0;
    do {
      uVar11 = uVar1;
      if (uVar11 == 7) break;
      uVar1 = uVar11 + 1;
    } while (*(int *)((long)&this->rep + uVar11 * 4 + 0xc) ==
             *(int *)((long)&other->rep + uVar11 * 4 + 0xc));
    if (6 < uVar11) {
      pCVar4 = (this->rep).full.root;
      bVar6 = (other->rep).compact.countPlusOne == 0;
      if (pCVar4 != (CharSetNode *)0x0 && !bVar6) {
        iVar9 = (*pCVar4->_vptr_CharSetNode[10])(pCVar4,2);
        return SUB41(iVar9,0);
      }
      return (pCVar4 == (CharSetNode *)0x0) == bVar6;
    }
  }
  return false;
}

Assistant:

bool CharSet<char16>::IsEqualTo(const CharSet<Char>& other) const
    {
        if (IsCompact())
        {
            if (!other.IsCompact())
                return false;
            if (rep.compact.countPlusOne != other.rep.compact.countPlusOne)
                return false;
            for (uint i = 0; i < this->GetCompactLength(); i++)
            {
                if (!other.Get(this->GetCompactChar(i)))
                    return false;
            }
            return true;
        }
        else
        {
            if (other.IsCompact())
                return false;
            if (!rep.full.direct.IsEqualTo(other.rep.full.direct))
                return false;
            if ((rep.full.root == nullptr) != (other.rep.full.root == nullptr))
                return false;
            if (rep.full.root == nullptr)
                return true;
            return rep.full.root->IsEqualTo(CharSetNode::levels - 1, other.rep.full.root);
        }
    }